

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxExtensions.cpp
# Opt level: O3

int sfglx_LoadFunctions(Display *display,int screen)

{
  byte bVar1;
  code *pcVar2;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  undefined4 in_register_00000034;
  byte *pbVar6;
  long *__s1;
  long *local_50 [2];
  long local_40 [2];
  
  sfglx_ext_EXT_swap_control = 0;
  sfglx_ext_MESA_swap_control = 0;
  sfglx_ext_SGI_swap_control = 0;
  sfglx_ext_EXT_framebuffer_sRGB = 0;
  sfglx_ext_ARB_framebuffer_sRGB = 0;
  sfglx_ext_ARB_multisample = 0;
  sfglx_ext_SGIX_pbuffer = 0;
  sfglx_ext_ARB_create_context = 0;
  sfglx_ext_ARB_create_context_profile = 0;
  pbVar4 = (byte *)glXQueryExtensionsString(display,CONCAT44(in_register_00000034,screen));
  pbVar6 = pbVar4;
  do {
    for (; (*pbVar6 & 0xdf) != 0; pbVar6 = pbVar6 + 1) {
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pbVar4,pbVar6);
    __s1 = local_50[0];
    lVar5 = 0x10;
    do {
      iVar3 = strcmp((char *)__s1,*(char **)((long)&PTR_typeinfo_0016bb90 + lVar5));
      if (iVar3 == 0) {
        pcVar2 = *(code **)((long)&ExtensionMap[0].extensionName + lVar5);
        if (pcVar2 == (code *)0x0) {
          iVar3 = 1;
        }
        else {
          iVar3 = (*pcVar2)();
          iVar3 = iVar3 + 1;
          __s1 = local_50[0];
        }
        **(int **)(&UNK_0016bb98 + lVar5) = iVar3;
        break;
      }
      lVar5 = lVar5 + 0x18;
    } while ((int)lVar5 != 0xe8);
    if (__s1 != local_40) {
      operator_delete(__s1,local_40[0] + 1);
    }
    pbVar4 = pbVar6 + 1;
    bVar1 = *pbVar6;
    pbVar6 = pbVar4;
    if (bVar1 == 0) {
      return 1;
    }
  } while( true );
}

Assistant:

int sfglx_LoadFunctions(Display* display, int screen)
{
    ClearExtensionVars();


    ProcExtsFromExtString(reinterpret_cast<const char*>(glXQueryExtensionsString(display, screen)));
    return sfglx_LOAD_SUCCEEDED;
}